

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS ref_layer_insert(REF_LAYER ref_layer,REF_GRID ref_grid)

{
  double dVar1;
  REF_INT RVar2;
  REF_INT RVar3;
  REF_INT node;
  REF_INT *pRVar4;
  REF_DBL *pRVar5;
  REF_DBL *pRVar6;
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  REF_CELL ref_cell;
  REF_NODE pRVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [16];
  REF_INT new_node;
  REF_BOOL has_support;
  REF_INT tet;
  REF_GLOB global;
  REF_DBL bary [4];
  REF_INT nodes [27];
  REF_INT local_124;
  int local_120;
  REF_INT local_11c;
  REF_GLOB local_118;
  REF_NODE local_110;
  REF_NODE local_108;
  long local_100;
  REF_DBL local_f8 [5];
  REF_LAYER local_d0;
  REF_CELL local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  REF_INT local_a8 [30];
  
  pRVar15 = ref_layer->ref_grid->node;
  lVar11 = (long)ref_layer->nnode_per_layer;
  if (lVar11 < 1) {
LAB_001f1623:
    uVar9 = ref_node_rebuild_sorted_global(pRVar15);
    if (uVar9 == 0) {
      uVar9 = 0;
    }
    else {
      pcVar14 = "rebuild";
      uVar10 = 0x146;
LAB_001f1652:
      uVar13 = (ulong)uVar9;
LAB_001f1655:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
             uVar10,"ref_layer_insert",uVar13,pcVar14);
    }
    return uVar9;
  }
  local_108 = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  local_100 = lVar11 * 0x78;
  lVar12 = 0;
  local_110 = pRVar15;
  local_c8 = ref_cell;
  local_c0 = lVar11;
LAB_001f1151:
  if ((lVar12 < pRVar15->max) && (local_118 = pRVar15->global[lVar12], -1 < local_118)) {
    local_11c = -1;
    if (local_118 < ref_cell->ref_adj->nnode) {
      local_11c = ref_cell->ref_adj->first[local_118];
    }
  }
  else {
    local_118 = -1;
    local_11c = -1;
  }
  local_b0 = lVar12 + lVar11;
  local_b8 = lVar12;
  uVar9 = ref_grid_enclosing_tet(ref_grid,pRVar15->real + local_b0 * 0xf,&local_11c,local_f8);
  if (uVar9 != 0) {
    pcVar14 = "enclosing tet";
    uVar10 = 0xe7;
    goto LAB_001f1652;
  }
  uVar9 = ref_cell_nodes(ref_cell,local_11c,local_a8);
  if (uVar9 != 0) {
    pcVar14 = "nodes";
    uVar10 = 0xe8;
    goto LAB_001f1652;
  }
  iVar17 = 0;
  iVar18 = 0;
  lVar11 = 0;
  do {
    auVar19 = *(undefined1 (*) [16])(local_f8 + lVar11);
    auVar7._8_8_ = auVar19._8_8_ ^ 0x8000000000000000;
    auVar7._0_8_ = auVar19._0_8_ ^ 0x8000000000000000;
    auVar19 = maxpd(auVar19,auVar7);
    iVar17 = iVar17 + (uint)(auVar19._0_8_ < 1e-10);
    iVar18 = iVar18 + (uint)(auVar19._8_8_ < 1e-10);
    lVar11 = lVar11 + 2;
  } while (lVar11 != 4);
  local_124 = -1;
  if (iVar18 + iVar17 == 2) {
    iVar18 = -1;
    lVar11 = 0;
    iVar17 = -1;
    do {
      dVar1 = local_f8[lVar11];
      if (dVar1 <= -dVar1) {
        dVar1 = -dVar1;
      }
      iVar8 = iVar18;
      if (((1e-10 <= dVar1) && (iVar8 = (int)lVar11, iVar18 != -1)) &&
         (bVar16 = iVar17 != -1, iVar8 = iVar18, iVar17 = (int)lVar11, bVar16)) {
        pcVar14 = "more non-zeros than nodes";
        uVar10 = 0xfb;
        goto LAB_001f16a6;
      }
      iVar18 = iVar8;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    if (iVar18 == -1) {
      pcVar14 = "non-zero node0 missing";
      uVar10 = 0xfd;
      goto LAB_001f16a6;
    }
    if (iVar17 == -1) {
      pcVar14 = "non-zero node1 missing";
      uVar10 = 0xfe;
      goto LAB_001f16a6;
    }
    RVar2 = local_a8[iVar18];
    RVar3 = local_a8[iVar17];
    uVar9 = ref_geom_supported(ref_grid->geom,RVar3,&local_120);
    if (uVar9 != 0) {
      pcVar14 = "got geom?";
      uVar10 = 0x102;
      goto LAB_001f1652;
    }
    if (local_120 == 0) {
      uVar9 = ref_geom_supported(ref_grid->geom,RVar2,&local_120);
      pRVar15 = local_108;
      if (uVar9 != 0) {
        pcVar14 = "got geom?";
        uVar10 = 0x105;
        goto LAB_001f1652;
      }
      if (local_120 != 0) {
        pcVar14 = "add geometry handling";
        uVar10 = 0x106;
        goto LAB_001f1a90;
      }
      uVar9 = ref_node_next_global(local_108,&local_118);
      if (uVar9 != 0) {
        pcVar14 = "next global";
        uVar10 = 0x107;
        goto LAB_001f1652;
      }
      uVar9 = ref_node_add(pRVar15,local_118,&local_124);
      if (uVar9 != 0) {
        pcVar14 = "new node";
        uVar10 = 0x108;
        goto LAB_001f1652;
      }
      uVar9 = ref_node_interpolate_edge(pRVar15,RVar2,RVar3,0.5,local_124);
      if (uVar9 != 0) {
        pcVar14 = "interp new node";
        uVar10 = 0x10a;
        goto LAB_001f1652;
      }
      uVar9 = ref_geom_add_between(ref_grid,RVar2,RVar3,0.5,local_124);
      if (uVar9 != 0) {
        pcVar14 = "geom new node";
        uVar10 = 0x10c;
        goto LAB_001f1652;
      }
      uVar9 = ref_geom_constrain(ref_grid,local_124);
      if (uVar9 != 0) {
        pcVar14 = "geom constraint";
        uVar10 = 0x10d;
        goto LAB_001f1652;
      }
      uVar9 = ref_split_edge(ref_grid,RVar2,RVar3,local_124);
      if (uVar9 != 0) {
        pcVar14 = "split";
        uVar10 = 0x10e;
        goto LAB_001f1652;
      }
      pRVar5 = local_108->real;
      pRVar6 = local_110->real;
      lVar11 = 0;
      do {
        pRVar5[(long)local_124 * 0xf + lVar11] = *(REF_DBL *)((long)pRVar6 + lVar11 * 8 + local_100)
        ;
        lVar11 = lVar11 + 1;
        pRVar15 = local_110;
      } while (lVar11 != 3);
LAB_001f15c5:
      lVar11 = local_c0;
      ref_cell = local_c8;
      if ((long)local_124 == -1) {
        pcVar14 = "new_node not set";
        uVar10 = 0x140;
LAB_001f16a6:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               uVar10,"ref_layer_insert",pcVar14);
        return 1;
      }
      pRVar15->global[local_b0] = (long)local_124;
      if ((ref_layer->verbose != 0) && (uVar9 = ref_validation_cell_volume(ref_grid), uVar9 != 0)) {
        pcVar14 = "vol";
        uVar10 = 0x143;
        goto LAB_001f1652;
      }
      lVar12 = local_b8 + 1;
      local_100 = local_100 + 0x78;
      if (lVar12 == lVar11) goto LAB_001f1623;
      goto LAB_001f1151;
    }
    pcVar14 = "add geometry handling";
    uVar10 = 0x103;
  }
  else if (iVar18 + iVar17 == 1) {
    iVar17 = -1;
    lVar11 = 0;
    do {
      dVar1 = local_f8[lVar11];
      if (dVar1 <= -dVar1) {
        dVar1 = -dVar1;
      }
      if (dVar1 < 1e-10) {
        if (iVar17 != -1) {
          pcVar14 = "more zeros than nodes";
          uVar10 = 0x11b;
          goto LAB_001f16a6;
        }
        iVar17 = (int)lVar11;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    if (iVar17 == -1) {
      pcVar14 = "non-zero node0 missing";
      uVar10 = 0x11d;
      goto LAB_001f16a6;
    }
    pRVar4 = ref_cell->f2n;
    RVar2 = local_a8[pRVar4[iVar17 * 4]];
    RVar3 = local_a8[pRVar4[iVar17 * 4 + 1]];
    node = local_a8[pRVar4[iVar17 * 4 + 2]];
    local_d0 = ref_layer;
    uVar9 = ref_geom_supported(ref_grid->geom,RVar2,&local_120);
    if (uVar9 != 0) {
      pcVar14 = "got geom?";
      uVar10 = 0x125;
      goto LAB_001f1652;
    }
    if (local_120 == 0) {
      uVar9 = ref_geom_supported(ref_grid->geom,RVar3,&local_120);
      if (uVar9 != 0) {
        pcVar14 = "got geom?";
        uVar10 = 0x128;
        goto LAB_001f1652;
      }
      if (local_120 == 0) {
        uVar9 = ref_geom_supported(ref_grid->geom,node,&local_120);
        pRVar15 = local_108;
        if (uVar9 == 0) {
          if (local_120 != 0) {
            pcVar14 = "add geometry handling";
            uVar10 = 300;
            goto LAB_001f1a90;
          }
          uVar9 = ref_node_next_global(local_108,&local_118);
          if (uVar9 == 0) {
            uVar9 = ref_node_add(pRVar15,local_118,&local_124);
            if (uVar9 == 0) {
              uVar9 = ref_node_interpolate_face(pRVar15,RVar2,RVar3,node,local_124);
              if (uVar9 == 0) {
                pRVar5 = pRVar15->real;
                pRVar6 = local_110->real;
                lVar11 = 0;
                do {
                  pRVar5[(long)local_124 * 0xf + lVar11] =
                       *(REF_DBL *)((long)pRVar6 + lVar11 * 8 + local_100);
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 3);
                uVar9 = ref_split_face(ref_grid,RVar2,RVar3,node,local_124);
                ref_layer = local_d0;
                pRVar15 = local_110;
                if (uVar9 == 0) {
                  if (local_d0->verbose != 0) {
                    printf("split zeros %d bary %f %f %f %f\n",local_f8[0],local_f8[1],local_f8[2],
                           local_f8[3],1);
                  }
                  goto LAB_001f15c5;
                }
                pcVar14 = "fsplit";
                uVar10 = 0x134;
              }
              else {
                pcVar14 = "interp new node";
                uVar10 = 0x130;
              }
            }
            else {
              pcVar14 = "new node";
              uVar10 = 0x12e;
            }
          }
          else {
            pcVar14 = "next global";
            uVar10 = 0x12d;
          }
        }
        else {
          pcVar14 = "got geom?";
          uVar10 = 299;
        }
        goto LAB_001f1652;
      }
      pcVar14 = "add geometry handling";
      uVar10 = 0x129;
    }
    else {
      pcVar14 = "add geometry handling";
      uVar10 = 0x126;
    }
  }
  else {
    if (ref_layer->verbose != 0) {
      printf("implement zeros %d bary %f %f %f %f\n",local_f8[0],local_f8[1],local_f8[2],local_f8[3]
            );
    }
    pcVar14 = "missing a general case";
    uVar10 = 0x13d;
  }
LAB_001f1a90:
  uVar9 = 6;
  uVar13 = 6;
  goto LAB_001f1655;
}

Assistant:

REF_FCN REF_STATUS ref_layer_insert(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_INT nnode_per_layer, node, local;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], node0, node1, node2, node3;
  REF_INT tet, i, new_node;
  REF_DBL bary[4];
  REF_INT zeros;
  REF_DBL zero_tol = 1.0e-10;
  REF_BOOL has_support;

  nnode_per_layer = ref_layer->nnode_per_layer;

  for (node = 0; node < nnode_per_layer; node++) {
    global = ref_node_global(layer_node, node); /* base */
    tet = ref_adj_first(ref_cell_adj(ref_cell), global);
    local = node + nnode_per_layer; /* target */
    RSS(ref_grid_enclosing_tet(ref_grid, ref_node_xyz_ptr(layer_node, local),
                               &tet, bary),
        "enclosing tet");
    RSS(ref_cell_nodes(ref_cell, tet, nodes), "nodes");
    zeros = 0;
    for (i = 0; i < 4; i++)
      if (ABS(bary[i]) < zero_tol) zeros++;
    new_node = REF_EMPTY;
    switch (zeros) {
      case 2: /* split an edge */
        node0 = REF_EMPTY;
        node1 = REF_EMPTY;
        for (i = 0; i < 4; i++)
          if (ABS(bary[i]) >= zero_tol) {
            if (node0 == REF_EMPTY) {
              node0 = i;
              continue;
            }
            if (node1 == REF_EMPTY) {
              node1 = i;
              continue;
            }
            THROW("more non-zeros than nodes");
          }
        if (node0 == REF_EMPTY) THROW("non-zero node0 missing");
        if (node1 == REF_EMPTY) THROW("non-zero node1 missing");
        node0 = nodes[node0];
        node1 = nodes[node1];
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node1, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node0, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        RSS(ref_node_interpolate_edge(ref_node, node0, node1, 0.5, new_node),
            "interp new node");
        RSS(ref_geom_add_between(ref_grid, node0, node1, 0.5, new_node),
            "geom new node");
        RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
        RSS(ref_split_edge(ref_grid, node0, node1, new_node), "split");
        for (i = 0; i < 3; i++)
          ref_node_xyz(ref_node, i, new_node) =
              ref_node_xyz(layer_node, i, local);
        break;
      case 1: /* split a triangular face*/
        node0 = REF_EMPTY;
        for (i = 0; i < 4; i++)
          if (ABS(bary[i]) < zero_tol) {
            if (node0 == REF_EMPTY) {
              node0 = i;
              continue;
            }
            THROW("more zeros than nodes");
          }
        if (node0 == REF_EMPTY) THROW("non-zero node0 missing");
        node1 = ref_cell_f2n_gen(ref_cell, 0, node0);
        node2 = ref_cell_f2n_gen(ref_cell, 1, node0);
        node3 = ref_cell_f2n_gen(ref_cell, 2, node0);
        node1 = nodes[node1];
        node2 = nodes[node2];
        node3 = nodes[node3];
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node1, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node2, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node3, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        RSS(ref_node_interpolate_face(ref_node, node1, node2, node3, new_node),
            "interp new node");
        for (i = 0; i < 3; i++)
          ref_node_xyz(ref_node, i, new_node) =
              ref_node_xyz(layer_node, i, local);
        RSS(ref_split_face(ref_grid, node1, node2, node3, new_node), "fsplit");
        if (ref_layer->verbose)
          printf("split zeros %d bary %f %f %f %f\n", zeros, bary[0], bary[1],
                 bary[2], bary[3]);
        break;
      default:
        if (ref_layer->verbose)
          printf("implement zeros %d bary %f %f %f %f\n", zeros, bary[0],
                 bary[1], bary[2], bary[3]);
        RSS(REF_IMPLEMENT, "missing a general case");
        break;
    }
    RAS(REF_EMPTY != new_node, "new_node not set");
    layer_node->global[local] = new_node;

    if (ref_layer->verbose) RSS(ref_validation_cell_volume(ref_grid), "vol");
  }

  RSS(ref_node_rebuild_sorted_global(layer_node), "rebuild");

  return REF_SUCCESS;
}